

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<8,_8192>::Mark(ObjectBlockPool<8,_8192> *this,uint number)

{
  MyLargeBlock *pMVar1;
  MyLargeBlock *pMVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (number < 2) {
    pMVar1 = this->activePages;
    if (pMVar1 != (MyLargeBlock *)0x0) {
      uVar4 = (ulong)this->lastNum;
      pMVar2 = pMVar1;
      do {
        if ((pMVar1 != pMVar2) || (iVar3 = (int)uVar4, uVar4 = 0, iVar3 != 0)) {
          uVar5 = 0;
          do {
            pMVar1->page[uVar5].marker =
                 pMVar1->page[uVar5].marker & 0xfffffffffffffffe | (ulong)number;
            uVar5 = uVar5 + 1;
            pMVar2 = this->activePages;
            uVar4 = (ulong)this->lastNum;
            uVar6 = 0x2000;
            if (pMVar1 == pMVar2) {
              uVar6 = uVar4;
            }
          } while (uVar5 < uVar6);
        }
        pMVar1 = pMVar1->next;
      } while (pMVar1 != (LargeBlock<8,_8192> *)0x0);
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<8, 8192>::Mark(unsigned int) [elemSize = 8, countInBlock = 8192]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}